

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

char * parse_string(cJSON *item,char *str)

{
  char cVar1;
  ulong in_RAX;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  uint uc;
  uint uc2;
  undefined8 local_38;
  
  pcVar2 = str;
  if (*str == '\"') {
    sVar6 = 1;
    pcVar4 = str + 1;
    for (pcVar2 = pcVar4; (cVar1 = *pcVar2, cVar1 != '\0' && (cVar1 != '\"'));
        pcVar2 = pcVar2 + (ulong)(cVar1 == '\\') + 1) {
      sVar6 = sVar6 + 1;
    }
    local_38 = in_RAX;
    pcVar3 = (char *)(*cJSON_malloc)(sVar6);
    pcVar7 = pcVar3;
    pcVar2 = ep;
    if (pcVar3 != (char *)0x0) {
LAB_0010b27f:
      cVar1 = *pcVar4;
      if (cVar1 == '\\') {
        cVar1 = pcVar4[1];
        switch(cVar1) {
        case 'n':
          *pcVar7 = '\n';
          break;
        case 'o':
        case 'p':
        case 'q':
        case 's':
switchD_0010b2c1_caseD_6f:
          *pcVar7 = cVar1;
          break;
        case 'r':
          *pcVar7 = '\r';
          break;
        case 't':
          *pcVar7 = '\t';
          break;
        case 'u':
          __isoc99_sscanf(pcVar4 + 2,"%4x",&local_38);
          pcVar2 = pcVar4 + 5;
          if ((uint)local_38 != 0 && ((uint)local_38 & 0xfffffc00) != 0xdc00) {
            if (((uint)local_38 & 0xfffffc00) != 0xd800) goto LAB_0010b38a;
            if ((pcVar4[6] == '\\') && (pcVar4[7] == 'u')) {
              __isoc99_sscanf(pcVar4 + 8,"%4x",(long)&local_38 + 4);
              pcVar2 = pcVar4 + 0xb;
              if (local_38._4_4_ - 0xe000 < 0xfffffc00) goto LAB_0010b431;
              local_38 = CONCAT44(local_38._4_4_,
                                  (local_38._4_4_ & 0x3ff) + ((uint)local_38 & 0x3bf) * 0x400 +
                                  0x10000);
LAB_0010b38a:
              iVar5 = 1;
              if ((0x7f < (uint)local_38) && (iVar5 = 2, 0x7ff < (uint)local_38)) {
                iVar5 = 4 - (uint)((uint)local_38 < 0x10000);
              }
              pcVar2 = (char *)(*(code *)((long)&DAT_0011c7cc +
                                         (long)(int)(&DAT_0011c7cc)[iVar5 - 1]))
                                         (&DAT_0011c7cc,
                                          (code *)((long)&DAT_0011c7cc +
                                                  (long)(int)(&DAT_0011c7cc)[iVar5 - 1]),
                                          local_38 & 0xffffffff,iVar5);
              return pcVar2;
            }
          }
          goto LAB_0010b431;
        default:
          if (cVar1 == 'f') {
            *pcVar7 = '\f';
          }
          else {
            if (cVar1 != 'b') goto switchD_0010b2c1_caseD_6f;
            *pcVar7 = '\b';
          }
        }
        pcVar7 = pcVar7 + 1;
        pcVar2 = pcVar4 + 1;
      }
      else {
        if ((cVar1 == '\0') || (cVar1 == '\"')) {
          *pcVar7 = '\0';
          cVar1 = *pcVar4;
          item->valuestring = pcVar3;
          item->type = 4;
          return pcVar4 + (cVar1 == '\"');
        }
        *pcVar7 = cVar1;
        pcVar7 = pcVar7 + 1;
        pcVar2 = pcVar4;
      }
LAB_0010b431:
      pcVar4 = pcVar2 + 1;
      goto LAB_0010b27f;
    }
  }
  ep = pcVar2;
  return (char *)0x0;
}

Assistant:

static const char *parse_string(cJSON *item,const char *str)
{
	const char *ptr=str+1;char *ptr2;char *out;int len=0;unsigned uc,uc2;
	if (*str!='\"') {ep=str;return 0;}	/* not a string! */
	
	while (*ptr!='\"' && *ptr && ++len) if (*ptr++ == '\\') ptr++;	/* Skip escaped quotes. */
	
	out=(char*)cJSON_malloc(len+1);	/* This is how long we need for the string, roughly. */
	if (!out) return 0;
	
	ptr=str+1;ptr2=out;
	while (*ptr!='\"' && *ptr)
	{
		if (*ptr!='\\') *ptr2++=*ptr++;
		else
		{
			ptr++;
			switch (*ptr)
			{
				case 'b': *ptr2++='\b';	break;
				case 'f': *ptr2++='\f';	break;
				case 'n': *ptr2++='\n';	break;
				case 'r': *ptr2++='\r';	break;
				case 't': *ptr2++='\t';	break;
				case 'u':	 /* transcode utf16 to utf8. */
					sscanf(ptr+1,"%4x",&uc);ptr+=4;	/* get the unicode char. */

					if ((uc>=0xDC00 && uc<=0xDFFF) || uc==0)	break;	// check for invalid.

					if (uc>=0xD800 && uc<=0xDBFF)	// UTF16 surrogate pairs.
					{
						if (ptr[1]!='\\' || ptr[2]!='u')	break;	// missing second-half of surrogate.
						sscanf(ptr+3,"%4x",&uc2);ptr+=6;
						if (uc2<0xDC00 || uc2>0xDFFF)		break;	// invalid second-half of surrogate.
						uc=0x10000 | ((uc&0x3FF)<<10) | (uc2&0x3FF);
					}

					len=4;if (uc<0x80) len=1;else if (uc<0x800) len=2;else if (uc<0x10000) len=3; ptr2+=len;
					
					switch (len) {
						case 4: *--ptr2 =((uc | 0x80) & 0xBF); uc >>= 6;
						case 3: *--ptr2 =((uc | 0x80) & 0xBF); uc >>= 6;
						case 2: *--ptr2 =((uc | 0x80) & 0xBF); uc >>= 6;
						case 1: *--ptr2 =(uc | firstByteMark[len]);
					}
					ptr2+=len;
					break;
				default:  *ptr2++=*ptr; break;
			}
			ptr++;
		}
	}
	*ptr2=0;
	if (*ptr=='\"') ptr++;
	item->valuestring=out;
	item->type=cJSON_String;
	return ptr;
}